

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_yplus_lengthscale2
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  REF_NODE pRVar4;
  REF_NODE ref_node;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  uint uVar7;
  REF_STATUS RVar8;
  void *pvVar9;
  REF_DBL *pRVar10;
  long lVar11;
  undefined8 uVar12;
  REF_CELL pRVar13;
  char *pcVar14;
  ulong uVar15;
  uint cell;
  long lVar16;
  double dVar17;
  double u;
  REF_INT new_node;
  REF_INT ntri;
  REF_GLOB global;
  REF_GRID exchange_grid;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  double *local_1f8;
  uint local_1ec;
  REF_NODE local_1e8;
  REF_CELL local_1e0;
  REF_CELL local_1d8;
  double local_1d0;
  double local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  REF_GRID local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_188 [3];
  REF_DBL *local_170;
  void *local_168;
  REF_DBL *local_160;
  double local_158;
  undefined8 uStack_150;
  long local_140;
  REF_CELL local_138;
  REF_DBL local_130;
  REF_DBL local_128;
  REF_DBL local_120;
  undefined8 local_118;
  int local_a8;
  int local_a4;
  int local_a0;
  
  if (ref_grid->twod == 0) {
    uVar12 = 0x34c;
LAB_001ba53d:
    uVar7 = 6;
    pcVar14 = "implement 3D";
    uVar15 = 6;
  }
  else {
    pRVar4 = ref_grid->node;
    local_130 = mach;
    local_128 = re;
    local_120 = reference_t_k;
    uVar7 = ref_grid_create(&local_1b0,ref_grid->mpi);
    if (uVar7 == 0) {
      ref_node = local_1b0->node;
      iVar2 = pRVar4->max;
      lVar16 = (long)iVar2;
      if (0 < lVar16) {
        pRVar5 = pRVar4->global;
        lVar11 = 0;
        do {
          if (-1 < pRVar5[lVar11]) {
            lengthscale[lVar11] = 0.0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar16 != lVar11);
      }
      if (iVar2 < 0) {
        pcVar14 = "malloc hits of REF_INT negative";
        uVar12 = 0x352;
LAB_001ba63d:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar12,"ref_phys_yplus_lengthscale2",pcVar14);
        return 1;
      }
      local_160 = field;
      pvVar9 = malloc(lVar16 * 4);
      if (pvVar9 == (void *)0x0) {
        pcVar14 = "malloc hits of REF_INT NULL";
        uVar12 = 0x352;
LAB_001ba670:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar12,"ref_phys_yplus_lengthscale2",pcVar14);
        return 2;
      }
      if (0 < iVar2) {
        memset(pvVar9,0,lVar16 * 4);
      }
      local_168 = pvVar9;
      uVar7 = ref_node_initialize_n_global(ref_node,0);
      if (uVar7 == 0) {
        pRVar13 = ref_grid->cell[0];
        local_1e8 = pRVar4;
        if (0 < pRVar13->max) {
          local_1d8 = ref_grid->cell[3];
          uVar15 = 0;
          cell = 0;
          local_1e0 = pRVar13;
          do {
            RVar8 = ref_cell_nodes(pRVar13,cell,(REF_INT *)&local_118);
            if (RVar8 == 0) {
              uVar7 = ref_layer_interior_seg_normal(ref_grid,cell,local_188);
              if (uVar7 != 0) {
                pcVar14 = "edge norm";
                uVar12 = 0x361;
                goto LAB_001ba511;
              }
              uVar7 = ref_cell_list_with2(ref_grid->cell[3],(REF_INT)local_118,local_118._4_4_,2,
                                          (REF_INT *)&local_1c0,(REF_INT *)&local_1a8);
              if (uVar7 != 0) {
                pcVar14 = "tri with2";
                uVar12 = 0x364;
                goto LAB_001ba511;
              }
              lVar16 = (long)(int)local_1c0;
              if (lVar16 != 1) {
                pcVar14 = "edg expects one tri";
                uVar15 = 1;
                uVar12 = 0x365;
                goto LAB_001baaba;
              }
              uVar7 = ref_cell_nodes(local_1d8,local_1a8._0_4_,&local_a8);
              if (uVar7 != 0) {
                pcVar14 = "tri nodes";
                uVar12 = 0x367;
                goto LAB_001ba511;
              }
              lVar16 = (long)(REF_INT)local_118;
              pRVar10 = local_1e8->real;
              lVar11 = (long)((((local_a8 - (REF_INT)local_118) + local_a4 + local_a0) -
                              local_118._4_4_) * 0xf);
              local_1d0 = (pRVar10[lVar11 + 1] - pRVar10[lVar16 * 0xf + 1]) * local_188[1];
              local_1c8 = (pRVar10[lVar11] - pRVar10[lVar16 * 0xf]) * local_188[0];
              local_158 = (pRVar10[lVar11 + 2] - pRVar10[lVar16 * 0xf + 2]) * local_188[2];
              uStack_150 = 0;
              uVar7 = ref_node_next_global(ref_node,&local_1b8);
              if (uVar7 != 0) {
                pcVar14 = "next";
                uVar12 = 0x372;
                goto LAB_001ba511;
              }
              uVar7 = ref_node_add(ref_node,CONCAT44(local_1b8._4_4_,(REF_INT)local_1b8),
                                   (REF_INT *)&local_1ec);
              if (uVar7 != 0) {
                pcVar14 = "add node";
                uVar12 = 0x373;
                goto LAB_001ba511;
              }
              lVar16 = (long)(int)local_1ec;
              if (cell != local_1ec) {
                uVar15 = (ulong)cell;
                pcVar14 = "expects new node to match edg";
                uVar12 = 0x374;
                goto LAB_001baaba;
              }
              dVar17 = local_158 + local_1c8 + local_1d0;
              if (dVar17 <= -dVar17) {
                dVar17 = -dVar17;
              }
              pRVar10 = local_1e8->real;
              pRVar6 = ref_node->real;
              lVar16 = 0;
              do {
                pRVar6[uVar15 + lVar16] =
                     (pRVar10[(long)(REF_INT)local_118 * 0xf + lVar16] +
                     pRVar10[(long)local_118._4_4_ * 0xf + lVar16]) * 0.5 +
                     local_188[lVar16] * (dVar17 + dVar17);
                lVar16 = lVar16 + 1;
                pRVar13 = local_1e0;
              } while (lVar16 != 3);
            }
            cell = cell + 1;
            uVar15 = (ulong)((int)uVar15 + 0xf);
          } while ((int)cell < pRVar13->max);
        }
        uVar7 = ref_node_synchronize_globals(ref_node);
        if (uVar7 == 0) {
          uVar7 = ref_node->max * ldim;
          if ((int)uVar7 < 0) {
            pcVar14 = "malloc exchange_field of REF_DBL negative";
            uVar12 = 0x37e;
            goto LAB_001ba63d;
          }
          pRVar10 = (REF_DBL *)malloc((ulong)uVar7 << 3);
          if (pRVar10 == (REF_DBL *)0x0) {
            pcVar14 = "malloc exchange_field of REF_DBL NULL";
            uVar12 = 0x37e;
            goto LAB_001ba670;
          }
          uVar7 = ref_interp_create((REF_INTERP *)&local_118,ref_grid,local_1b0);
          if (uVar7 == 0) {
            uVar7 = ref_interp_locate((REF_INTERP)CONCAT44(local_118._4_4_,(REF_INT)local_118));
            if (uVar7 == 0) {
              uVar7 = ref_interp_scalar((REF_INTERP)CONCAT44(local_118._4_4_,(REF_INT)local_118),
                                        ldim,local_160,pRVar10);
              if (uVar7 == 0) {
                local_170 = pRVar10;
                if (ref_grid->twod == 0) {
                  uVar12 = 0x3bd;
                  goto LAB_001ba53d;
                }
                pRVar13 = ref_grid->cell[0];
                pvVar9 = local_168;
                if (0 < pRVar13->max) {
                  local_1e0 = ref_grid->cell[3];
                  local_1f8 = pRVar10 + 3;
                  lVar16 = (long)ldim << 3;
                  lVar11 = 0;
                  local_140 = lVar16;
                  local_138 = pRVar13;
                  do {
                    RVar8 = ref_cell_nodes(pRVar13,(REF_INT)lVar11,(REF_INT *)&local_118);
                    if (RVar8 == 0) {
                      uVar7 = ref_layer_interior_seg_normal(ref_grid,(REF_INT)lVar11,local_188);
                      if (uVar7 != 0) {
                        pcVar14 = "edge norm";
                        uVar12 = 0x394;
                        goto LAB_001ba511;
                      }
                      uVar7 = ref_cell_list_with2(ref_grid->cell[3],(REF_INT)local_118,
                                                  local_118._4_4_,2,(REF_INT *)&local_1ec,
                                                  (REF_INT *)&local_1b8);
                      if (uVar7 != 0) {
                        pcVar14 = "tri with2";
                        uVar12 = 0x397;
                        goto LAB_001ba511;
                      }
                      lVar16 = (long)(int)local_1ec;
                      if (lVar16 != 1) {
                        pcVar14 = "edg expects one tri";
                        uVar15 = 1;
                        uVar12 = 0x398;
LAB_001baaba:
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,uVar12,"ref_phys_yplus_lengthscale2",pcVar14,uVar15,lVar16);
                        return 1;
                      }
                      uVar7 = ref_cell_nodes(local_1e0,(REF_INT)local_1b8,&local_a8);
                      iVar2 = local_a4;
                      if (uVar7 != 0) {
                        pcVar14 = "tri nodes";
                        uVar12 = 0x39a;
                        goto LAB_001ba511;
                      }
                      dVar17 = (double)(long)(REF_INT)local_118;
                      local_1c8 = (double)CONCAT44(local_1c8._4_4_,local_a8);
                      local_1d8 = (REF_CELL)CONCAT44(local_1d8._4_4_,local_a0);
                      local_1d0 = (double)(long)local_118._4_4_;
                      pRVar10 = local_1e8->real;
                      local_1a8 = pRVar10[(long)local_1d0 * 0xf] - pRVar10[(long)dVar17 * 0xf];
                      local_1a0 = pRVar10[(long)local_1d0 * 0xf + 1] -
                                  pRVar10[(long)dVar17 * 0xf + 1];
                      local_198 = pRVar10[(long)local_1d0 * 0xf + 2] -
                                  pRVar10[(long)dVar17 * 0xf + 2];
                      local_158 = dVar17;
                      uVar7 = ref_math_normalize(&local_1a8);
                      if (uVar7 != 0) {
                        pcVar14 = "normalize tangent";
                        uVar12 = 0x3a4;
                        goto LAB_001ba511;
                      }
                      pRVar10 = local_1e8->real;
                      lVar16 = (long)(((iVar2 + (int)local_1d8 +
                                       (local_1c8._0_4_ - SUB84(local_158,0))) - local_1d0._0_4_) *
                                     0xf);
                      u = 0.0 - (*local_1f8 * local_198 +
                                local_1f8[-2] * local_1a8 + local_1a0 * local_1f8[-1]);
                      if (u <= -u) {
                        u = -u;
                      }
                      dVar17 = (pRVar10[lVar16 + 2] - pRVar10[(long)dVar17 * 0xf + 2]) *
                               local_188[2] +
                               (pRVar10[lVar16] - pRVar10[(long)dVar17 * 0xf]) * local_188[0] +
                               (pRVar10[lVar16 + 1] - pRVar10[(long)dVar17 * 0xf + 1]) *
                               local_188[1];
                      if (dVar17 <= -dVar17) {
                        dVar17 = -dVar17;
                      }
                      lVar16 = (long)(SUB84(local_158,0) * ldim);
                      uVar7 = ref_phys_yplus_dist(local_130,local_128,local_120,local_160[lVar16],
                                                  (local_160[lVar16 + 4] / local_160[lVar16]) * 1.4,
                                                  dVar17 + dVar17,u,(REF_DBL *)&local_1c0);
                      if (uVar7 != 0) {
                        pcVar14 = "yplus dist";
                        uVar12 = 0x3b6;
                        goto LAB_001ba511;
                      }
                      lVar16 = (long)(REF_INT)local_118;
                      lengthscale[lVar16] =
                           lengthscale[lVar16] + (double)CONCAT44(local_1c0._4_4_,(int)local_1c0);
                      piVar1 = (int *)((long)local_168 + lVar16 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar16 = (long)local_118._4_4_;
                      lengthscale[lVar16] =
                           (double)CONCAT44(local_1c0._4_4_,(int)local_1c0) + lengthscale[lVar16];
                      piVar1 = (int *)((long)local_168 + lVar16 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar16 = local_140;
                      pvVar9 = local_168;
                      pRVar13 = local_138;
                    }
                    lVar11 = lVar11 + 1;
                    local_1f8 = (double *)((long)local_1f8 + lVar16);
                  } while (lVar11 < pRVar13->max);
                }
                pRVar4 = local_1e8;
                iVar2 = local_1e8->max;
                if (0 < (long)iVar2) {
                  pRVar5 = local_1e8->global;
                  lVar16 = 0;
                  do {
                    if ((-1 < pRVar5[lVar16]) &&
                       (iVar3 = *(int *)((long)pvVar9 + lVar16 * 4), 0 < iVar3)) {
                      lengthscale[lVar16] = lengthscale[lVar16] / (double)iVar3;
                    }
                    lVar16 = lVar16 + 1;
                  } while (iVar2 != lVar16);
                }
                free(pvVar9);
                uVar7 = ref_node_ghost_dbl(pRVar4,lengthscale,1);
                if (uVar7 == 0) {
                  free(local_170);
                  uVar7 = ref_grid_free(local_1b0);
                  if (uVar7 == 0) {
                    return 0;
                  }
                  pcVar14 = "free";
                  uVar12 = 0x3c9;
                }
                else {
                  pcVar14 = "ghost lengthscale";
                  uVar12 = 0x3c6;
                }
              }
              else {
                pcVar14 = "interp scalar";
                uVar12 = 0x385;
              }
            }
            else {
              pcVar14 = "nearest";
              uVar12 = 899;
            }
          }
          else {
            pcVar14 = "make interp";
            uVar12 = 0x382;
          }
        }
        else {
          pcVar14 = "sync global";
          uVar12 = 0x37d;
        }
      }
      else {
        pcVar14 = "init nnodesg";
        uVar12 = 0x354;
      }
    }
    else {
      pcVar14 = "create exchange";
      uVar12 = 0x34f;
    }
LAB_001ba511:
    uVar15 = (ulong)uVar7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar12,
         "ref_phys_yplus_lengthscale2",uVar15,pcVar14);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale2(REF_GRID ref_grid, REF_DBL mach,
                                               REF_DBL re,
                                               REF_DBL reference_t_k,
                                               REF_INT ldim, REF_DBL *field,
                                               REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  REF_GRID exchange_grid;
  REF_NODE exchange_node;
  REF_DBL *exchange_field;
  REF_DBL stretch = 2.0;
  if (!ref_grid_twod(ref_grid)) RSS(REF_IMPLEMENT, "implement 3D");

  RSS(ref_grid_create(&exchange_grid, ref_grid_mpi(ref_grid)),
      "create exchange");
  exchange_node = ref_grid_node(exchange_grid);
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);

  RSS(ref_node_initialize_n_global(exchange_node, 0), "init nnodesg");

  {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri, ixyz;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node, new_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    REF_GLOB global;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      RSS(ref_node_next_global(exchange_node, &global), "next");
      RSS(ref_node_add(exchange_node, global, &new_node), "add node");
      REIS(edg, new_node, "expects new node to match edg");
      for (ixyz = 0; ixyz < 3; ixyz++) {
        ref_node_xyz(exchange_node, ixyz, new_node) =
            0.5 * (ref_node_xyz(ref_node, ixyz, edg_nodes[0]) +
                   ref_node_xyz(ref_node, ixyz, edg_nodes[1])) +
            stretch * dn * edg_norm[ixyz];
      }
    }
  }
  RSS(ref_node_synchronize_globals(exchange_node), "sync global");
  ref_malloc(exchange_field, ldim * ref_node_max(exchange_node), REF_DBL);

  {
    REF_INTERP ref_interp;
    RSS(ref_interp_create(&ref_interp, ref_grid, exchange_grid), "make interp");
    RSS(ref_interp_locate(ref_interp), "nearest");
    RSS(ref_interp_scalar(ref_interp, ldim, field, exchange_field),
        "interp scalar");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(exchange_field[1 + ldim * edg]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = stretch * ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  ref_free(exchange_field);
  RSS(ref_grid_free(exchange_grid), "free");

  return REF_SUCCESS;
}